

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O3

uint ON_IsRhinoApplicationId(ON_UUID id)

{
  bool bVar1;
  uint uVar2;
  ON_UUID_struct local_10;
  
  bVar1 = operator==(&ON_rhino2_id,&local_10);
  uVar2 = 2;
  if (!bVar1) {
    bVar1 = operator==(&ON_rhino3_id,&local_10);
    uVar2 = 3;
    if (!bVar1) {
      bVar1 = operator==(&ON_rhino4_id,&local_10);
      uVar2 = 4;
      if (!bVar1) {
        bVar1 = operator==(&ON_rhino5_id,&local_10);
        uVar2 = 5;
        if (!bVar1) {
          bVar1 = operator==(&ON_rhino6_id,&local_10);
          uVar2 = 6;
          if (!bVar1) {
            bVar1 = operator==(&ON_rhino7_id,&local_10);
            uVar2 = 7;
            if (!bVar1) {
              bVar1 = operator==(&ON_rhino8_id,&local_10);
              uVar2 = (uint)bVar1 << 3;
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_IsRhinoApplicationId(
  ON_UUID id
  )
{
  if (ON_rhino2_id == id)
    return 2;
  if (ON_rhino3_id == id)
    return 3;
  if (ON_rhino4_id == id)
    return 4;
  if (ON_rhino5_id == id)
    return 5;
  if (ON_rhino6_id == id)
    return 6;
  if (ON_rhino7_id == id)
    return 7;
  if (ON_rhino8_id == id)
    return 8;
  return 0;
}